

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameter.cpp
# Opt level: O0

void CoreMLConverter::convertCaffeParameter(ConvertLayerParameters layerParameters)

{
  RepeatedField<float> *this;
  bool bVar1;
  int iVar2;
  string *psVar3;
  string *psVar4;
  BlobShape *pBVar5;
  int64 iVar6;
  BlobProto *pBVar7;
  WeightParams *this_00;
  RepeatedField<float> *other;
  NetParameter *in_stack_00000008;
  float local_274;
  RepeatedField<float> *local_270;
  RepeatedField<float> *dataWrite;
  string local_260;
  string local_240;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  int local_180;
  int local_17c;
  int caffeBlobSize;
  int blobSize;
  int64_t w;
  int64_t h;
  int64_t c;
  LoadConstantLayerParams *pLStack_158;
  int dim;
  LoadConstantLayerParams *specLayerParams;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  ParameterParameter *local_b0;
  ParameterParameter *caffeLayerParams;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  allocator local_61;
  string local_60;
  NeuralNetworkLayer *local_40;
  NeuralNetworkLayer *specLayer;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *nnWrite;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *mappingDataBlobNames;
  LayerParameter *caffeLayerWeights;
  LayerParameter *pLStack_18;
  int layerIdWeights;
  LayerParameter *caffeLayer;
  int layerId;
  
  caffeLayer._4_4_ = *(int *)&((layerParameters.caffeNetworkInputNames)->_M_t)._M_impl;
  pLStack_18 = caffe::NetParameter::layer(in_stack_00000008,caffeLayer._4_4_);
  caffeLayerWeights._4_4_ =
       getLayerIndex(pLStack_18,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      *)layerParameters.mappingDataBlobNames);
  mappingDataBlobNames =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)caffe::NetParameter::layer(layerParameters.prototxt,caffeLayerWeights._4_4_);
  nnWrite = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)layerParameters._24_8_;
  specLayer = (NeuralNetworkLayer *)layerParameters.protoweights;
  local_40 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                       ((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
                        layerParameters.protoweights);
  iVar2 = caffe::LayerParameter::top_size(pLStack_18);
  if (iVar2 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,"Must have 1 output",&local_61);
    psVar3 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    psVar4 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
    errorInCaffeProto(&local_60,psVar3,psVar4);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&top.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&caffeLayerParams);
  psVar3 = caffe::LayerParameter::top_abi_cxx11_(pLStack_18,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&caffeLayerParams,psVar3);
  psVar3 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
  convertCaffeMetadata
            (psVar3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&top.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&caffeLayerParams,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)specLayer,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)nnWrite);
  local_b0 = caffe::LayerParameter::parameter_param(pLStack_18);
  bVar1 = caffe::ParameterParameter::has_shape(local_b0);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d0,"Must have \'shape\' set",&local_d1);
    psVar3 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    psVar4 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
    errorInCaffeProto(&local_d0,psVar3,psVar4);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  }
  pBVar5 = caffe::ParameterParameter::shape(local_b0);
  iVar2 = caffe::BlobShape::dim_size(pBVar5);
  if (iVar2 != 3) {
    pBVar5 = caffe::ParameterParameter::shape(local_b0);
    iVar2 = caffe::BlobShape::dim_size(pBVar5);
    if (iVar2 != 4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_f8,"\'shape\' must be either 3 or 4 dimensions",&local_f9);
      psVar3 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
      psVar4 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
      errorInCaffeProto(&local_f8,psVar3,psVar4);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    }
  }
  pBVar5 = caffe::ParameterParameter::shape(local_b0);
  iVar2 = caffe::BlobShape::dim_size(pBVar5);
  if (iVar2 == 4) {
    pBVar5 = caffe::ParameterParameter::shape(local_b0);
    iVar6 = caffe::BlobShape::dim(pBVar5,0);
    if (iVar6 != 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_120,"if \'shape\' is of 4 dimesnions, first one must be 1",
                 &local_121);
      psVar3 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
      psVar4 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
      errorInCaffeProto(&local_120,psVar3,psVar4);
      std::__cxx11::string::~string((string *)&local_120);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
    }
  }
  iVar2 = caffe::LayerParameter::blobs_size((LayerParameter *)mappingDataBlobNames);
  if (iVar2 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_148,"Must have 1 weight blob",
               (allocator *)((long)&specLayerParams + 7));
    psVar3 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    psVar4 = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
    errorInCaffeProto(&local_148,psVar3,psVar4);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)((long)&specLayerParams + 7));
  }
  pLStack_158 = CoreML::Specification::NeuralNetworkLayer::mutable_loadconstant(local_40);
  pBVar5 = caffe::ParameterParameter::shape(local_b0);
  c._4_4_ = caffe::BlobShape::dim_size(pBVar5);
  pBVar5 = caffe::ParameterParameter::shape(local_b0);
  h = caffe::BlobShape::dim(pBVar5,c._4_4_ + -3);
  pBVar5 = caffe::ParameterParameter::shape(local_b0);
  w = caffe::BlobShape::dim(pBVar5,c._4_4_ + -2);
  pBVar5 = caffe::ParameterParameter::shape(local_b0);
  _caffeBlobSize = caffe::BlobShape::dim(pBVar5,c._4_4_ + -1);
  if (h < 0) {
    __assert_fail("c >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Parameter.cpp"
                  ,0x3b,
                  "void CoreMLConverter::convertCaffeParameter(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  CoreML::Specification::LoadConstantLayerParams::add_shape(pLStack_158,h);
  if (w < 0) {
    __assert_fail("h >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Parameter.cpp"
                  ,0x3d,
                  "void CoreMLConverter::convertCaffeParameter(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  CoreML::Specification::LoadConstantLayerParams::add_shape(pLStack_158,w);
  if (-1 < (long)_caffeBlobSize) {
    CoreML::Specification::LoadConstantLayerParams::add_shape(pLStack_158,_caffeBlobSize);
    local_17c = (int)h * (int)w * caffeBlobSize;
    pBVar7 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
    local_180 = caffe::BlobProto::data_size(pBVar7);
    if (local_180 != local_17c) {
      std::__cxx11::to_string(&local_220,local_17c);
      std::operator+(&local_200,"Expected blob size = ",&local_220);
      std::operator+(&local_1e0,&local_200," but found blob of size = ");
      std::__cxx11::to_string(&local_240,local_180);
      std::operator+(&local_1c0,&local_1e0,&local_240);
      std::operator+(&local_1a0,&local_1c0," in caffe");
      psVar3 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_260,"Inner Product",(allocator *)((long)&dataWrite + 7));
      errorInCaffeProto(&local_1a0,psVar3,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::allocator<char>::~allocator((allocator<char> *)((long)&dataWrite + 7));
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_220);
    }
    this_00 = CoreML::Specification::LoadConstantLayerParams::mutable_data(pLStack_158);
    local_270 = CoreML::Specification::WeightParams::mutable_floatvalue(this_00);
    local_274 = 0.0;
    google::protobuf::RepeatedField<float>::Resize(local_270,local_17c,&local_274);
    this = local_270;
    pBVar7 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
    other = caffe::BlobProto::data(pBVar7);
    google::protobuf::RepeatedField<float>::CopyFrom(this,other);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&caffeLayerParams);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&top.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    return;
  }
  __assert_fail("w >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Parameter.cpp"
                ,0x3f,
                "void CoreMLConverter::convertCaffeParameter(CoreMLConverter::ConvertLayerParameters)"
               );
}

Assistant:

void CoreMLConverter::convertCaffeParameter(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
   
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    top.push_back(caffeLayer.top(0));
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::ParameterParameter& caffeLayerParams = caffeLayer.parameter_param();
    //***************** Some Error Checking in Caffe Proto **********
    if (!caffeLayerParams.has_shape()){
        CoreMLConverter::errorInCaffeProto("Must have 'shape' set", caffeLayer.name(), caffeLayer.type());
    }
    if (! (caffeLayerParams.shape().dim_size() == 3 || caffeLayerParams.shape().dim_size() == 4)){
        CoreMLConverter::errorInCaffeProto("'shape' must be either 3 or 4 dimensions",caffeLayer.name(), caffeLayer.type());
    }
    if (caffeLayerParams.shape().dim_size() == 4 && caffeLayerParams.shape().dim(0) != 1){
        CoreMLConverter::errorInCaffeProto("if 'shape' is of 4 dimesnions, first one must be 1",caffeLayer.name(), caffeLayer.type());
    }
    if (caffeLayerWeights.blobs_size() != 1){
        CoreMLConverter::errorInCaffeProto("Must have 1 weight blob",caffeLayer.name(), caffeLayer.type());
    }
    //***************************************************************
    Specification::LoadConstantLayerParams* specLayerParams = specLayer->mutable_loadconstant();
    int dim = caffeLayerParams.shape().dim_size();
    int64_t c = caffeLayerParams.shape().dim(dim-3);
    int64_t h = caffeLayerParams.shape().dim(dim-2);
    int64_t w = caffeLayerParams.shape().dim(dim-1);
    assert(c >= 0);
    specLayerParams->add_shape(static_cast<uint64_t>(c));
    assert(h >= 0);
    specLayerParams->add_shape(static_cast<uint64_t>(h));
    assert(w >= 0);
    specLayerParams->add_shape(static_cast<uint64_t>(w));

    int blobSize = static_cast<int> (c*h*w);
    int caffeBlobSize = caffeLayerWeights.blobs(0).data_size();
    if (caffeBlobSize != blobSize){
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(blobSize)+" but found blob of size = "+
                        std::to_string(caffeBlobSize)+" in caffe", caffeLayer.name(), "Inner Product");
    }
    ::google::protobuf::RepeatedField<float>* dataWrite = specLayerParams->mutable_data()->mutable_floatvalue();
    dataWrite->Resize(blobSize, 0.0);
    dataWrite->CopyFrom(caffeLayerWeights.blobs(0).data());
}